

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O1

bool __thiscall SQClass::GetAttributes(SQClass *this,SQObjectPtr *key,SQObjectPtr *outval)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQClassMember *pSVar4;
  SQTable *pSVar5;
  bool bVar6;
  ulong uVar7;
  SQClassMemberVec *pSVar8;
  SQObjectPtr idx;
  SQObjectPtr local_28;
  
  local_28.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_28.super_SQObject._type = OT_NULL;
  bVar6 = SQTable::Get(this->_members,key,&local_28);
  if (bVar6) {
    pSVar8 = &this->_methods;
    if (((uint)local_28.super_SQObject._unVal.fFloat >> 0x19 & 1) != 0) {
      pSVar8 = &this->_defaultvalues;
    }
    pSVar4 = pSVar8->_vals;
    uVar7 = (ulong)(((uint)local_28.super_SQObject._unVal.fFloat & 0xffffff) << 5);
    SVar2 = (outval->super_SQObject)._type;
    pSVar5 = (outval->super_SQObject)._unVal.pTable;
    (outval->super_SQObject)._unVal =
         *(SQObjectValue *)((long)&(pSVar4->attrs).super_SQObject._unVal + uVar7);
    SVar3 = *(SQObjectType *)((long)&(pSVar4->attrs).super_SQObject._type + uVar7);
    (outval->super_SQObject)._type = SVar3;
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(((outval->super_SQObject)._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
  }
  SQObjectPtr::~SQObjectPtr(&local_28);
  return bVar6;
}

Assistant:

bool SQClass::GetAttributes(const SQObjectPtr &key,SQObjectPtr &outval)
{
    SQObjectPtr idx;
    if(_members->Get(key,idx)) {
        outval = (_isfield(idx)?_defaultvalues[_member_idx(idx)].attrs:_methods[_member_idx(idx)].attrs);
        return true;
    }
    return false;
}